

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

void __thiscall icu_63::UnicodeString::releaseBuffer(UnicodeString *this,int32_t newLength)

{
  int32_t iVar1;
  char16_t *pcVar2;
  bool bVar3;
  UChar *limit;
  UChar *p;
  UChar *array;
  int32_t capacity;
  int32_t newLength_local;
  UnicodeString *this_local;
  
  if ((((this->fUnion).fStackFields.fLengthAndFlags & 0x10U) != 0) && (-2 < newLength)) {
    iVar1 = getCapacity(this);
    if (newLength == -1) {
      pcVar2 = getArrayStart(this);
      limit = pcVar2;
      while( true ) {
        bVar3 = false;
        if (limit < pcVar2 + iVar1) {
          bVar3 = *limit != L'\0';
        }
        if (!bVar3) break;
        limit = limit + 1;
      }
      array._4_4_ = (int32_t)((long)limit - (long)pcVar2 >> 1);
    }
    else {
      array._4_4_ = newLength;
      if (iVar1 < newLength) {
        array._4_4_ = iVar1;
      }
    }
    setLength(this,array._4_4_);
    (this->fUnion).fStackFields.fLengthAndFlags =
         (this->fUnion).fStackFields.fLengthAndFlags & 0xffef;
  }
  return;
}

Assistant:

void
UnicodeString::releaseBuffer(int32_t newLength) {
  if(fUnion.fFields.fLengthAndFlags&kOpenGetBuffer && newLength>=-1) {
    // set the new fLength
    int32_t capacity=getCapacity();
    if(newLength==-1) {
      // the new length is the string length, capped by fCapacity
      const UChar *array=getArrayStart(), *p=array, *limit=array+capacity;
      while(p<limit && *p!=0) {
        ++p;
      }
      newLength=(int32_t)(p-array);
    } else if(newLength>capacity) {
      newLength=capacity;
    }
    setLength(newLength);
    fUnion.fFields.fLengthAndFlags&=~kOpenGetBuffer;
  }
}